

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::EnsureClearDebugDocument(ScriptContext *this)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *this_00;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar2;
  int i;
  long lVar3;
  
  if ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    pLVar2 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->sourceList);
    for (lVar3 = 0;
        lVar3 < (pLVar2->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar3 = lVar3 + 1) {
      pRVar1 = (pLVar2->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar3].ptr;
      if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (this_00 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
            this_00 != (Utf8SourceInfo *)0x0)) {
        Utf8SourceInfo::ClearDebugDocument(this_00,true);
      }
    }
  }
  return;
}

Assistant:

void ScriptContext::EnsureClearDebugDocument()
    {
        if (this->sourceList)
        {
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();
                if (sourceInfo)
                {
                    sourceInfo->ClearDebugDocument();
                }
            });
        }
    }